

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_dss.c
# Opt level: O3

void duckdb_je_extent_dss_boot(void)

{
  dss_base = sbrk(0);
  dss_extending.repr = false;
  dss_exhausted.repr = dss_base == (void *)0xffffffffffffffff;
  dss_max.repr = dss_base;
  return;
}

Assistant:

void
extent_dss_boot(void) {
	cassert(have_dss);

	dss_base = extent_dss_sbrk(0);
	atomic_store_b(&dss_extending, false, ATOMIC_RELAXED);
	atomic_store_b(&dss_exhausted, dss_base == SBRK_INVALID, ATOMIC_RELAXED);
	atomic_store_p(&dss_max, dss_base, ATOMIC_RELAXED);
}